

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O3

int __thiscall
CDesign::GetWireInDirection
          (CDesign *this,vector<CNet_*,_std::allocator<CNet_*>_> *pNetList,
          vector<CWire_*,_std::allocator<CWire_*>_> *pWireList,int iPos,int iDirection,int iMode,
          int iValue)

{
  pointer ppCVar1;
  CNet *this_00;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (2 < iValue - 1U) {
    if (iValue == 0x1000002) {
      uVar3 = (uint)((ulong)((long)(pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (0 < (int)uVar3) {
        uVar5 = 0;
        do {
          ppCVar1 = (pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar4 = uVar5;
          if ((ulong)((long)(pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar5)
          goto LAB_001092f9;
          this_00 = ppCVar1[uVar5];
          iVar2 = CNet::IsFlat(this_00);
          if ((iVar2 != 0) && (((this_00->super_CObject).m_iProp & 2) != 0)) {
            CNet::GetWireInDirection(this_00,pWireList,iPos,iDirection,0,0x30f);
          }
          uVar5 = uVar5 + 1;
        } while ((uVar3 & 0x7fffffff) != uVar5);
      }
      goto LAB_0010926b;
    }
    if (iValue != 0x30f) goto LAB_0010926b;
  }
  uVar3 = (uint)((ulong)((long)(pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar3) {
    uVar5 = 0;
    do {
      ppCVar1 = (pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar4 = (ulong)(uint)iMode;
      if ((ulong)((long)(pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar5) {
LAB_001092f9:
        do {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar5);
          uVar5 = uVar4;
        } while( true );
      }
      CNet::GetWireInDirection(ppCVar1[uVar5],pWireList,iPos,iDirection,iMode,iValue);
      uVar5 = uVar5 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar5);
  }
LAB_0010926b:
  return (int)((ulong)((long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int CDesign::GetWireInDirection(vector<CNet*>* pNetList, vector<CWire*>* pWireList, int iPos, int iDirection, int iMode, int iValue)
{
	switch(iValue){
		case STATE_WIRE_ANY:
		case STATE_WIRE_ROUTED:
		case STATE_WIRE_UNROUTED:
		case PROP_WIRE_ANY:
			for(int i=0,s=pNetList->size();i<s;i++)
			{
				CNet*	pNet	=	pNetList->at(i);
				pNet->GetWireInDirection(pWireList,iPos,iDirection,iMode,iValue);
			}
			break;
		case PROP_NET_FLAT|PROP_NET_TWOPIN:
			for(int i=0,s=pNetList->size();i<s;i++)
			{
				CNet*	pNet	=	pNetList->at(i);
				if(pNet->IsFlat()&&pNet->GetProp()&PROP_NET_TWOPIN)
					pNet->GetWireInDirection(pWireList,iPos,iDirection);
			}
			break;
	}


	return	pWireList->size();
}